

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O2

void __thiscall chrono::ChOptimizerGenetic::LogOut(ChOptimizerGenetic *this,bool filelog)

{
  Scalar SVar1;
  undefined4 uVar2;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *pDVar3;
  Scalar *pSVar4;
  ChLog *pCVar5;
  
  pDVar3 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this->his_average;
  if ((pDVar3 != (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)0x0) &&
     (this->generations_done <= *(long *)(pDVar3 + 8))) {
    SVar1 = this->average;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (pDVar3,this->generations_done + -1);
    *pSVar4 = SVar1;
  }
  pDVar3 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this->his_stdeviation;
  if ((pDVar3 != (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)0x0) &&
     (this->generations_done <= *(long *)(pDVar3 + 8))) {
    SVar1 = this->stdeviation;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (pDVar3,this->generations_done + -1);
    *pSVar4 = SVar1;
  }
  pDVar3 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this->his_maxfitness;
  if ((pDVar3 != (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)0x0) &&
     (this->generations_done <= *(long *)(pDVar3 + 8))) {
    SVar1 = this->max_fitness;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (pDVar3,this->generations_done + -1);
    *pSVar4 = SVar1;
  }
  pDVar3 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this->his_minfitness;
  if ((pDVar3 != (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)0x0) &&
     (this->generations_done <= *(long *)(pDVar3 + 8))) {
    SVar1 = this->min_fitness;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (pDVar3,this->generations_done + -1);
    *pSVar4 = SVar1;
  }
  if (filelog) {
    pCVar5 = GetLog();
    uVar2 = *(undefined4 *)&(pCVar5->super_ChStreamOutAscii).field_0x1c;
    pCVar5 = GetLog();
    *(undefined4 *)&(pCVar5->super_ChStreamOutAscii).field_0x1c = 2;
    pCVar5 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar5->super_ChStreamOutAscii,"\n\nGENERATION ------- n. ");
    pCVar5 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar5->super_ChStreamOutAscii,(int)this->generations_done);
    pCVar5 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar5->super_ChStreamOutAscii,"\n  STATISTICS:");
    pCVar5 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar5->super_ChStreamOutAscii,"\n     max:   ");
    pCVar5 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar5->super_ChStreamOutAscii,this->max_fitness);
    pCVar5 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar5->super_ChStreamOutAscii,"\n     min:   ");
    pCVar5 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar5->super_ChStreamOutAscii,this->min_fitness);
    pCVar5 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar5->super_ChStreamOutAscii,"\n     media: ");
    pCVar5 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar5->super_ChStreamOutAscii,this->average);
    pCVar5 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar5->super_ChStreamOutAscii,"\n     stdev: ");
    pCVar5 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar5->super_ChStreamOutAscii,this->stdeviation);
    pCVar5 = GetLog();
    ChStreamOutAscii::operator<<
              (&pCVar5->super_ChStreamOutAscii,"\n  Fitness of best individual ever born: ");
    pCVar5 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar5->super_ChStreamOutAscii,this->best_indiv->fitness);
    pCVar5 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar5->super_ChStreamOutAscii,"\n");
    pCVar5 = GetLog();
    *(undefined4 *)&(pCVar5->super_ChStreamOutAscii).field_0x1c = uVar2;
  }
  return;
}

Assistant:

void ChOptimizerGenetic::LogOut(bool filelog) {
    if (his_average && his_average->size() >= generations_done)
        (*his_average)(generations_done - 1) = average;
    if (his_stdeviation && his_stdeviation->size() >= generations_done)
        (*his_stdeviation)(generations_done - 1) = stdeviation;
    if (his_maxfitness && his_maxfitness->size() >= generations_done)
        (*his_maxfitness)(generations_done - 1) = max_fitness;
    if (his_minfitness && his_minfitness->size() >= generations_done)
        (*his_minfitness)(generations_done - 1) = min_fitness;

    if (filelog) {
        ChLog::eChLogLevel oldfilemode = GetLog().GetCurrentLevel();
        GetLog().SetCurrentLevel(ChLog::CHMESSAGE);

        GetLog() << "\n\nGENERATION ------- n. ";
        GetLog() << (int)generations_done;
        GetLog() << "\n  STATISTICS:";
        GetLog() << "\n     max:   ";
        GetLog() << max_fitness;
        GetLog() << "\n     min:   ";
        GetLog() << min_fitness;
        GetLog() << "\n     media: ";
        GetLog() << average;
        GetLog() << "\n     stdev: ";
        GetLog() << stdeviation;
        GetLog() << "\n  Fitness of best individual ever born: ";
        GetLog() << best_indiv->fitness;
        GetLog() << "\n";

        GetLog().SetCurrentLevel(oldfilemode);
    }
}